

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t expectedUnits;
  bool bVar1;
  int iVar2;
  int iVar3;
  Result *pRVar4;
  LoadConstantNDLayerParams *this_00;
  WeightParams *pWVar5;
  string *psVar6;
  uint64 uVar7;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  Result local_1b0;
  int local_184;
  uint64_t uStack_180;
  int i;
  size_t total_shape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string err;
  WeightParamType paramType;
  LoadConstantNDLayerParams *params;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,0,0);
  pRVar4 = Result::operator=((Result *)local_48,&local_70);
  bVar1 = Result::good(pRVar4);
  Result::~Result(&local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    validateOutputCount((Result *)&params,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    pRVar4 = Result::operator=((Result *)local_48,(Result *)&params);
    bVar1 = Result::good(pRVar4);
    Result::~Result((Result *)&params);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = Specification::NeuralNetworkLayer::loadconstantnd
                          ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar5 = Specification::LoadConstantNDLayerParams::data(this_00);
      err.field_2._12_4_ = valueType(pWVar5);
      iVar2 = Specification::LoadConstantNDLayerParams::shape_size(this_00);
      if (iVar2 == 0) {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+(&local_f8,"Target shape is required parameter for \'",psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,&local_f8,"\' layer.");
        std::__cxx11::string::~string((string *)&local_f8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
        local_80 = 1;
        std::__cxx11::string::~string((string *)local_d8);
      }
      else if (err.field_2._12_4_ == 4) {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+(&local_138,"LoadConstantND layer \'",psVar6);
        std::operator+(&local_118,&local_138,
                       "\' has both full precision and half precision weight fields populated");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        local_80 = 1;
      }
      else {
        iVar2 = Specification::LoadConstantNDLayerParams::shape_size(this_00);
        if (0 < iVar2) {
          iVar2 = Specification::LoadConstantNDLayerParams::shape_size(this_00);
          if (iVar2 < 6) {
            uStack_180 = 1;
            local_184 = 0;
            while( true ) {
              iVar2 = local_184;
              iVar3 = Specification::LoadConstantNDLayerParams::shape_size(this_00);
              if (iVar3 <= iVar2) break;
              uVar7 = Specification::LoadConstantNDLayerParams::shape(this_00,local_184);
              uStack_180 = uVar7 * uStack_180;
              local_184 = local_184 + 1;
            }
            pWVar5 = Specification::LoadConstantNDLayerParams::data(this_00);
            expectedUnits = uStack_180;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1d0,"LoadConstantND",&local_1d1);
            psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1f8,"constants",&local_1f9);
            validateGeneralWeightParams
                      (&local_1b0,pWVar5,expectedUnits,1,&local_1d0,psVar6,&local_1f8);
            Result::operator=((Result *)local_48,&local_1b0);
            Result::~Result(&local_1b0);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            bVar1 = Result::good((Result *)local_48);
            if (bVar1) {
              Result::Result(__return_storage_ptr__);
              local_80 = 1;
            }
            else {
              Result::Result(__return_storage_ptr__,(Result *)local_48);
              local_80 = 1;
            }
            goto LAB_00a41374;
          }
        }
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &total_shape,"LoadConstantND layer \'",psVar6);
        std::operator+(&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &total_shape,"\'can only accept shape of length 1 to 5");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&total_shape);
        local_80 = 1;
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_80 = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_80 = 1;
  }
LAB_00a41374:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantNDLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 0, 0)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;

    const auto& params = layer.loadconstantnd();
    WeightParamType paramType = valueType(params.data());

    if (params.shape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "' has both full precision and half precision weight fields populated");
    }
    if (!(params.shape_size() >= 1 && params.shape_size() <= 5)) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "'can only accept shape of length 1 to 5");
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }

    r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstantND", layer.name(), "constants");
    if (!r.good()) return r;

    return Result();
}